

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_cost.cpp
# Opt level: O1

void duckdb_brotli::BrotliEstimateBitCostsForLiterals
               (size_t pos,size_t len,size_t mask,uint8_t *data,size_t *histogram,float *cost)

{
  long *plVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  byte bVar9;
  ulong *puVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined8 uVar20;
  size_t in_window_utf8 [3];
  ulong local_a8;
  ulong local_88 [2];
  float *local_78;
  ulong local_70 [5];
  double local_48;
  undefined8 uStack_40;
  
  local_78 = cost;
  iVar3 = BrotliIsMostlyUTF8(data,pos,mask,len,0.75);
  if (iVar3 == 0) {
    local_a8 = 2000;
    if (len < 2000) {
      local_a8 = len;
    }
    switchD_0105b559::default(histogram,0,0x800);
    uVar4 = pos;
    uVar7 = local_a8;
    if (len != 0) {
      do {
        histogram[data[uVar4 & mask]] = histogram[data[uVar4 & mask]] + 1;
        uVar7 = uVar7 - 1;
        uVar4 = uVar4 + 1;
      } while (uVar7 != 0);
      uVar4 = 2000;
      do {
        if (1999 < uVar4 - 2000) {
          histogram[data[pos - 2000 & mask]] = histogram[data[pos - 2000 & mask]] - 1;
          local_a8 = local_a8 - 1;
        }
        if (uVar4 < len) {
          histogram[data[pos + 2000 & mask]] = histogram[data[pos + 2000 & mask]] + 1;
          local_a8 = local_a8 + 1;
        }
        uVar7 = histogram[data[pos & mask]];
        lVar12 = uVar7 + (uVar7 == 0);
        if (local_a8 < 0x100) {
          dVar19 = (double)(&kBrotliLog2Table)[local_a8];
          uVar20 = 0;
        }
        else {
          auVar17._8_4_ = (int)(local_a8 >> 0x20);
          auVar17._0_8_ = local_a8;
          auVar17._12_4_ = 0x45300000;
          dVar19 = log2((auVar17._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_a8) - 4503599627370496.0));
          uVar20 = extraout_XMM0_Qb_00;
        }
        if (uVar7 < 0x100) {
          dVar14 = (double)(&kBrotliLog2Table)[lVar12];
        }
        else {
          auVar18._8_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar18._0_8_ = lVar12;
          auVar18._12_4_ = 0x45300000;
          local_48 = dVar19;
          uStack_40 = uVar20;
          dVar14 = log2((auVar18._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0));
          dVar19 = local_48;
        }
        dVar19 = (dVar19 - dVar14) + 0.029;
        local_78[uVar4 - 2000] =
             (float)(double)(-(ulong)(dVar19 < 1.0) & (ulong)(dVar19 * 0.5 + 0.5) |
                            ~-(ulong)(dVar19 < 1.0) & (ulong)dVar19);
        pos = pos + 1;
        sVar6 = uVar4 - 1999;
        uVar4 = uVar4 + 1;
      } while (sVar6 != len);
    }
  }
  else {
    local_70[1] = 0;
    local_70[0] = 0;
    local_88[0] = 0;
    if (len != 0) {
      sVar6 = pos;
      sVar8 = len;
      bVar9 = 0;
      do {
        bVar2 = data[sVar6 & mask];
        puVar10 = local_70 + 1;
        if ((((char)bVar2 < '\0') && (puVar10 = local_70, bVar2 < 0xc0)) &&
           (puVar10 = local_70 + 1, 0xdf < bVar9)) {
          puVar10 = local_88;
        }
        *puVar10 = *puVar10 + 1;
        sVar6 = sVar6 + 1;
        sVar8 = sVar8 - 1;
        bVar9 = bVar2;
      } while (sVar8 != 0);
    }
    uVar4 = local_70[0] + local_88[0];
    sVar6 = 0x1ef;
    if (len < 0x1ef) {
      sVar6 = len;
    }
    local_70[1] = 0;
    local_70[2] = 0;
    local_70[3] = 0;
    switchD_0105b559::default(histogram,0,0x1800);
    if (len != 0) {
      uVar11 = (ulong)(0x18 < uVar4);
      uVar7 = 0;
      sVar8 = pos;
      uVar4 = 0;
      do {
        bVar9 = data[sVar8 & mask];
        histogram[(ulong)bVar9 + uVar7 * 0x100] = histogram[(ulong)bVar9 + uVar7 * 0x100] + 1;
        local_70[uVar7 + 1] = local_70[uVar7 + 1] + 1;
        if ((char)bVar9 < '\0') {
          uVar7 = uVar11;
          if ((bVar9 < 0xc0) && (uVar4 < 0xe0)) {
            uVar7 = 0;
          }
        }
        else {
          uVar7 = 0;
        }
        sVar8 = sVar8 + 1;
        sVar6 = sVar6 - 1;
        uVar4 = (ulong)bVar9;
      } while (sVar6 != 0);
      lVar12 = 2000;
      uVar4 = 0;
      do {
        uVar7 = 0;
        if (0x1ee < uVar4) {
          if (uVar4 == 0x1ef) {
            bVar9 = 0;
          }
          else {
            bVar9 = data[(uVar4 + pos) - 0x1f0 & mask];
          }
          if (uVar4 < 0x1f1) {
            uVar5 = 0;
          }
          else {
            uVar5 = uVar11;
            if (data[(uVar4 + pos) - 0x1f1 & mask] < 0xe0) {
              uVar5 = uVar7;
            }
          }
          if (0xbf < bVar9) {
            uVar5 = uVar11;
          }
          if (bVar9 < 0x80) {
            uVar5 = uVar7;
          }
          plVar1 = (long *)((long)histogram +
                           (ulong)((int)uVar5 * 0x800 + (uint)data[(uVar4 + pos) - 0x1ef & mask] * 8
                                  ));
          *plVar1 = *plVar1 + -1;
          local_70[uVar5 + 1] = local_70[uVar5 + 1] - 1;
        }
        if (uVar4 + 0x1ef < len) {
          if ((char)data[uVar4 + pos + 0x1ee & mask] < '\0') {
            uVar5 = uVar11;
            if ((data[uVar4 + pos + 0x1ee & mask] < 0xc0) &&
               (data[uVar4 + pos + 0x1ed & mask] < 0xe0)) {
              uVar5 = 0;
            }
          }
          else {
            uVar5 = 0;
          }
          plVar1 = (long *)((long)histogram +
                           (ulong)((int)uVar5 * 0x800 + (uint)data[uVar4 + pos + 0x1ef & mask] * 8))
          ;
          *plVar1 = *plVar1 + 1;
          local_70[uVar5 + 1] = local_70[uVar5 + 1] + 1;
        }
        if (uVar4 == 0) {
          bVar9 = 0;
        }
        else {
          bVar9 = data[(uVar4 + pos) - 1 & mask];
        }
        if (uVar4 < 2) {
          uVar5 = 0;
        }
        else {
          uVar5 = uVar11;
          if (data[(uVar4 + pos) - 2 & mask] < 0xe0) {
            uVar5 = uVar7;
          }
        }
        if (0xbf < bVar9) {
          uVar5 = uVar11;
        }
        if (bVar9 < 0x80) {
          uVar5 = uVar7;
        }
        uVar7 = *(ulong *)((long)histogram +
                          (ulong)((int)uVar5 * 0x800 + (uint)data[uVar4 + pos & mask] * 8));
        lVar13 = uVar7 + (uVar7 == 0);
        uVar5 = local_70[uVar5 + 1];
        if (uVar5 < 0x100) {
          dVar19 = (double)(&kBrotliLog2Table)[uVar5];
          uVar20 = 0;
        }
        else {
          auVar15._8_4_ = (int)(uVar5 >> 0x20);
          auVar15._0_8_ = uVar5;
          auVar15._12_4_ = 0x45300000;
          dVar19 = log2((auVar15._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
          uVar20 = extraout_XMM0_Qb;
        }
        if (uVar7 < 0x100) {
          dVar14 = (double)(&kBrotliLog2Table)[lVar13];
        }
        else {
          auVar16._8_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar16._0_8_ = lVar13;
          auVar16._12_4_ = 0x45300000;
          local_48 = dVar19;
          uStack_40 = uVar20;
          dVar14 = log2((auVar16._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0));
          dVar19 = local_48;
        }
        dVar19 = (dVar19 - dVar14) + 0.02905;
        dVar19 = (double)(-(ulong)(dVar19 < 1.0) & (ulong)(dVar19 * 0.5 + 0.5) |
                         ~-(ulong)(dVar19 < 1.0) & (ulong)dVar19);
        if (uVar4 < 2000) {
          dVar19 = dVar19 + ((double)lVar12 / -2000.0) * 0.35 + 0.7;
        }
        local_78[uVar4] = (float)dVar19;
        uVar4 = uVar4 + 1;
        lVar12 = lVar12 + -1;
      } while (len != uVar4);
    }
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliEstimateBitCostsForLiterals(size_t pos, size_t len, size_t mask,
                                       const uint8_t* data,
                                       size_t* histogram, float* cost) {
  if (BrotliIsMostlyUTF8(data, pos, mask, len, kMinUTF8Ratio)) {
    EstimateBitCostsForLiteralsUTF8(pos, len, mask, data, histogram, cost);
    return;
  } else {
    size_t window_half = 2000;
    size_t in_window = BROTLI_MIN(size_t, window_half, len);
    size_t i;
    memset(histogram, 0, 256 * sizeof(histogram[0]));

    /* Bootstrap histogram. */
    for (i = 0; i < in_window; ++i) {
      ++histogram[data[(pos + i) & mask]];
    }

    /* Compute bit costs with sliding window. */
    for (i = 0; i < len; ++i) {
      size_t histo;
      if (i >= window_half) {
        /* Remove a byte in the past. */
        --histogram[data[(pos + i - window_half) & mask]];
        --in_window;
      }
      if (i + window_half < len) {
        /* Add a byte in the future. */
        ++histogram[data[(pos + i + window_half) & mask]];
        ++in_window;
      }
      histo = histogram[data[(pos + i) & mask]];
      if (histo == 0) {
        histo = 1;
      }
      {
        double lit_cost = FastLog2(in_window) - FastLog2(histo);
        lit_cost += 0.029;
        if (lit_cost < 1.0) {
          lit_cost *= 0.5;
          lit_cost += 0.5;
        }
        cost[i] = (float)lit_cost;
      }
    }
  }
}